

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

boolean exist_artifact(int otyp,char *name)

{
  int iVar1;
  short *psVar2;
  boolean *pbVar3;
  
  if (otyp == 0) {
    return '\0';
  }
  if (*name != '\0') {
    pbVar3 = artiexist;
    for (psVar2 = &artilist[1].otyp; pbVar3 = pbVar3 + 1, *psVar2 != 0; psVar2 = psVar2 + 0x20) {
      if ((*psVar2 == otyp) &&
         (iVar1 = strcmp(((artifact *)(psVar2 + -0x1d))->name,name), iVar1 == 0)) {
        return *pbVar3;
      }
    }
  }
  return '\0';
}

Assistant:

boolean exist_artifact(int otyp, const char *name)
{
	const struct artifact *a;
	boolean *arex;

	if (otyp && *name)
	    for (a = artilist+1,arex = artiexist+1; a->otyp; a++,arex++)
		if ((int) a->otyp == otyp && !strcmp(a->name, name))
		    return *arex;
	return FALSE;
}